

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void __thiscall QPainter::drawPoints(QPainter *this,QPointF *points,int pointCount)

{
  double *pdVar1;
  qreal *pqVar2;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  TransformationType TVar3;
  PenCapStyle PVar4;
  QPainterState *pQVar5;
  QPaintEngine *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  QPainterPath path;
  QPen pen;
  QPainterPath local_58;
  QPen local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    drawPoints();
  }
  else if (0 < pointCount) {
    pQVar6 = &(this_00._M_head_impl)->extended->super_QPaintEngine;
    if (pQVar6 != (QPaintEngine *)0x0) {
LAB_003d33c9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*((QPaintEngine *)&pQVar6->_vptr_QPaintEngine)->_vptr_QPaintEngine[0xc])
                  (pQVar6,points,(ulong)(uint)pointCount);
        return;
      }
      goto LAB_003d35b4;
    }
    QPainterPrivate::updateState
              (this_00._M_head_impl,
               ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
    pQVar5 = ((this_00._M_head_impl)->state)._M_t.
             super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
             super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
             super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
    if (pQVar5->emulationSpecifier == 1) {
      TVar3 = QTransform::type(&pQVar5->matrix);
      if (TVar3 == TxTranslate) {
        lVar7 = 0;
        do {
          pQVar5 = ((this_00._M_head_impl)->state)._M_t.
                   super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                   super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                   super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
          pdVar1 = (double *)((long)&points->xp + lVar7);
          local_48.xp = (pQVar5->matrix).m_matrix[2][0] + *pdVar1;
          local_48.yp = (pQVar5->matrix).m_matrix[2][1] + pdVar1[1];
          pQVar6 = ((this_00._M_head_impl)->engine)._M_t.
                   super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t
                   .super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
                   super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
          (*pQVar6->_vptr_QPaintEngine[0xc])(pQVar6,&local_48,1);
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uint)pointCount << 4 != lVar7);
        goto LAB_003d3595;
      }
      pQVar5 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
    }
    else if (pQVar5->emulationSpecifier == 0) {
      pQVar6 = ((this_00._M_head_impl)->engine)._M_t.
               super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
               super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
               super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
      goto LAB_003d33c9;
    }
    local_50.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QPen::QPen(&local_50,&pQVar5->pen);
    PVar4 = QPen::capStyle(&local_50);
    if (PVar4 == FlatCap) {
      save(this);
      QPen::setCapStyle(&local_50,SquareCap);
      setPen(this,&local_50);
    }
    local_58.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&local_58);
    lVar7 = 0;
    do {
      pqVar2 = (qreal *)((long)&points->xp + lVar7);
      local_48.xp = *pqVar2;
      local_48.yp = pqVar2[1];
      QPainterPath::moveTo(&local_58,&local_48);
      local_48.yp = *(double *)((long)&points->yp + lVar7);
      local_48.xp = *(double *)((long)&points->xp + lVar7) + 0.0001;
      QPainterPath::lineTo(&local_58,&local_48);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)pointCount << 4 != lVar7);
    QPainterPrivate::draw_helper(this_00._M_head_impl,&local_58,StrokeDraw);
    if (PVar4 == FlatCap) {
      restore(this);
    }
    QPainterPath::~QPainterPath(&local_58);
    QPen::~QPen(&local_50);
  }
LAB_003d3595:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003d35b4:
  __stack_chk_fail();
}

Assistant:

void QPainter::drawPoints(const QPointF *points, int pointCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPoints(), count=%d\n", pointCount);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPoints: Painter not active");
        return;
    }

    if (pointCount <= 0)
        return;

    if (d->extended) {
        d->extended->drawPoints(points, pointCount);
        return;
    }

    d->updateState(d->state);

    if (!d->state->emulationSpecifier) {
        d->engine->drawPoints(points, pointCount);
        return;
    }

    if (d->state->emulationSpecifier == QPaintEngine::PrimitiveTransform
        && d->state->matrix.type() == QTransform::TxTranslate) {
        // ### use drawPoints function
        for (int i=0; i<pointCount; ++i) {
            QPointF pt(points[i].x() + d->state->matrix.dx(),
                       points[i].y() + d->state->matrix.dy());
            d->engine->drawPoints(&pt, 1);
        }
    } else {
        QPen pen = d->state->pen;
        bool flat_pen = pen.capStyle() == Qt::FlatCap;
        if (flat_pen) {
            save();
            pen.setCapStyle(Qt::SquareCap);
            setPen(pen);
        }
        QPainterPath path;
        for (int i=0; i<pointCount; ++i) {
            path.moveTo(points[i].x(), points[i].y());
            path.lineTo(points[i].x() + 0.0001, points[i].y());
        }
        d->draw_helper(path, QPainterPrivate::StrokeDraw);
        if (flat_pen)
            restore();
    }
}